

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

void __thiscall ON_ErrorLog::Dump(ON_ErrorLog *this,ON_TextLog *text_log)

{
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  ON_TextLogIndent indent1;
  uint count;
  ON_TextLog *text_log_local;
  ON_ErrorLog *this_local;
  
  indent1._12_4_ = Count(this);
  ON_TextLog::Print(text_log,"Error log: %u events\n",(ulong)(uint)indent1._12_4_);
  ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_30,text_log);
  for (local_34 = 0; local_34 < (uint)indent1._12_4_; local_34 = local_34 + 1) {
    ON_ErrorEvent::Dump(this->m_events + local_34,text_log);
  }
  ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_30);
  return;
}

Assistant:

void ON_ErrorLog::Dump(
  class ON_TextLog& text_log
) const
{
  const unsigned int count = Count();
  text_log.Print("Error log: %u events\n", count);
  ON_TextLogIndent indent1(text_log);
  for (unsigned int i = 0; i < count; i++)
  {
    m_events[i].Dump(text_log);
  }
}